

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O2

void WebRtcIsac_AllPoleFilter(double *InOut,double *Coef,size_t lengthInOut,int orderCoef)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  size_t sVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = *Coef;
  if ((dVar7 <= 0.9999) || (1.0001 <= dVar7)) {
    uVar1 = 0;
    uVar3 = (ulong)(uint)orderCoef;
    if (orderCoef < 1) {
      uVar3 = uVar1;
    }
    for (; uVar1 != lengthInOut; uVar1 = uVar1 + 1) {
      dVar8 = *InOut * (1.0 / dVar7);
      *InOut = dVar8;
      pdVar2 = Coef + 1;
      for (lVar6 = 0; -lVar6 != uVar3; lVar6 = lVar6 + -1) {
        dVar8 = dVar8 + *pdVar2 * -(1.0 / dVar7) * InOut[lVar6 + -1];
        *InOut = dVar8;
        pdVar2 = pdVar2 + 1;
      }
      InOut = InOut + 1;
    }
  }
  else {
    pdVar2 = InOut + -2;
    for (sVar4 = 0; sVar4 != lengthInOut; sVar4 = sVar4 + 1) {
      dVar7 = Coef[1] * InOut[-1];
      pdVar5 = pdVar2;
      for (lVar6 = 2; lVar6 <= orderCoef; lVar6 = lVar6 + 1) {
        dVar7 = dVar7 + Coef[lVar6] * *pdVar5;
        pdVar5 = pdVar5 + -1;
      }
      *InOut = *InOut - dVar7;
      InOut = InOut + 1;
      pdVar2 = pdVar2 + 1;
    }
  }
  return;
}

Assistant:

void WebRtcIsac_AllPoleFilter(double* InOut,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef) {
  /* the state of filter is assumed to be in InOut[-1] to InOut[-orderCoef] */
  double scal;
  double sum;
  size_t n;
  int k;

  //if (fabs(Coef[0]-1.0)<0.001) {
  if ( (Coef[0] > 0.9999) && (Coef[0] < 1.0001) )
  {
    for(n = 0; n < lengthInOut; n++)
    {
      sum = Coef[1] * InOut[-1];
      for(k = 2; k <= orderCoef; k++){
        sum += Coef[k] * InOut[-k];
      }
      *InOut++ -= sum;
    }
  }
  else
  {
    scal = 1.0 / Coef[0];
    for(n=0;n<lengthInOut;n++)
    {
      *InOut *= scal;
      for(k=1;k<=orderCoef;k++){
        *InOut -= scal*Coef[k]*InOut[-k];
      }
      InOut++;
    }
  }
}